

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

shared_ptr<pbrt::syntactic::ParamArray<int>_> __thiscall
pbrt::syntactic::ParamSet::findParam<int>(ParamSet *this,string *name)

{
  const_iterator cVar1;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<pbrt::syntactic::ParamArray<int>_> sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                  *)name,in_RDX);
  if (cVar1._M_node == (_Base_ptr)&name->_M_string_length) {
    *(undefined8 *)&(this->param)._M_t._M_impl = 0;
    *(undefined8 *)&(this->param)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    sVar3 = Param::as<int>((Param *)this);
    _Var2 = sVar3.super___shared_ptr<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar3.super___shared_ptr<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pbrt::syntactic::ParamArray<int>_>)
         sVar3.super___shared_ptr<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ParamArray<T> > findParam(const std::string &name) const {
        auto it = param.find(name);
        if (it == param.end()) return typename ParamArray<T>::SP();
        return it->second->as<T>(); //std::dynamic_pointer_cast<ParamArray<T> >(it->second);
      }